

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O2

size_type __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> v,size_type pos)

{
  ulong uVar1;
  not_in_view __pred;
  reverse_iterator<const_char_*> local_20;
  const_pointer local_18;
  reverse_iterator<const_char_*> local_10 [2];
  
  while( true ) {
    uVar1 = this->size_;
    if (uVar1 == 0) {
      return 0xffffffffffffffff;
    }
    if (pos < uVar1) break;
    pos = uVar1 - 1;
  }
  local_18 = this->data_;
  local_10[0].current = local_18 + pos + 1;
  __pred.v.size_ = (size_type)v.data_;
  __pred.v.data_ = (const_pointer)&local_18;
  std::
  find_if<std::reverse_iterator<char_const*>,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::not_in_view>
            (&local_20,local_10,__pred);
  if (local_20.current == this->data_) {
    return 0xffffffffffffffff;
  }
  return (size_type)(local_20.current + ~(ulong)this->data_);
}

Assistant:

bool empty() const nssv_noexcept
    {
        return 0 == size_;
    }